

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::analysis::Struct::IsSameImpl(Struct *this,Type *that,IsSameCache *seen)

{
  pointer ppTVar1;
  Type *pTVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  undefined4 extraout_var;
  size_type sVar7;
  mapped_type *__x;
  _Base_ptr p_Var8;
  size_t i;
  ulong uVar9;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_60;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  local_48;
  long lVar6;
  
  iVar5 = (*that->_vptr_Type[0x1e])(that);
  lVar6 = CONCAT44(extraout_var,iVar5);
  if ((((lVar6 != 0) &&
       ((long)(this->element_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->element_types_).
              super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
              ._M_impl.super__Vector_impl_data._M_start ==
        *(long *)(lVar6 + 0x30) - *(long *)(lVar6 + 0x28))) &&
      ((this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_node_count ==
       *(size_t *)(lVar6 + 0x68))) &&
     (bVar3 = analysis::Type::HasSameDecorations(&this->super_Type,that), bVar3)) {
    uVar9 = 0;
    do {
      ppTVar1 = (this->element_types_).
                super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->element_types_).
                        super__Vector_base<const_spvtools::opt::analysis::Type_*,_std::allocator<const_spvtools::opt::analysis::Type_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppTVar1 >> 3) <= uVar9) {
        p_Var8 = (this->element_decorations_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        while( true ) {
          bVar3 = (_Rb_tree_header *)p_Var8 ==
                  &(this->element_decorations_)._M_t._M_impl.super__Rb_tree_header;
          if (bVar3) {
            return bVar3;
          }
          sVar7 = std::
                  map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                  ::count((map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                           *)(lVar6 + 0x40),&p_Var8[1]._M_color);
          if (sVar7 == 0) break;
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::vector(&local_60,
                   (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    *)&p_Var8[1]._M_parent);
          __x = std::
                map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                ::at((map<unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>_>_>
                      *)(lVar6 + 0x40),&p_Var8[1]._M_color);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::vector(&local_48,__x);
          bVar4 = anon_unknown_33::CompareTwoVectors(&local_60,&local_48);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_48);
          std::
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ::~vector(&local_60);
          if (!bVar4) {
            return bVar3;
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        }
        return bVar3;
      }
      pTVar2 = ppTVar1[uVar9];
      iVar5 = (*pTVar2->_vptr_Type[2])
                        (pTVar2,*(undefined8 *)(*(long *)(lVar6 + 0x28) + uVar9 * 8),seen);
      uVar9 = uVar9 + 1;
    } while ((char)iVar5 != '\0');
  }
  return false;
}

Assistant:

bool Struct::IsSameImpl(const Type* that, IsSameCache* seen) const {
  const Struct* st = that->AsStruct();
  if (!st) return false;
  if (element_types_.size() != st->element_types_.size()) return false;
  const auto size = element_decorations_.size();
  if (size != st->element_decorations_.size()) return false;
  if (!HasSameDecorations(that)) return false;

  for (size_t i = 0; i < element_types_.size(); ++i) {
    if (!element_types_[i]->IsSameImpl(st->element_types_[i], seen))
      return false;
  }
  for (const auto& p : element_decorations_) {
    if (st->element_decorations_.count(p.first) == 0) return false;
    if (!CompareTwoVectors(p.second, st->element_decorations_.at(p.first)))
      return false;
  }
  return true;
}